

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O1

FT_Pointer ft_service_list_lookup(FT_ServiceDesc service_descriptors,char *service_id)

{
  int iVar1;
  FT_ServiceDesc pFVar2;
  char *__s1;
  
  if ((service_id != (char *)0x0 && service_descriptors != (FT_ServiceDesc)0x0) &&
     (__s1 = service_descriptors->serv_id, __s1 != (char *)0x0)) {
    pFVar2 = service_descriptors + 1;
    do {
      iVar1 = strcmp(__s1,service_id);
      if (iVar1 == 0) {
        return pFVar2[-1].serv_data;
      }
      __s1 = pFVar2->serv_id;
      pFVar2 = pFVar2 + 1;
    } while (__s1 != (char *)0x0);
  }
  return (FT_Pointer)0x0;
}

Assistant:

FT_BASE_DEF( FT_Pointer )
  ft_service_list_lookup( FT_ServiceDesc  service_descriptors,
                          const char*     service_id )
  {
    FT_Pointer      result = NULL;
    FT_ServiceDesc  desc   = service_descriptors;


    if ( desc && service_id )
    {
      for ( ; desc->serv_id != NULL; desc++ )
      {
        if ( ft_strcmp( desc->serv_id, service_id ) == 0 )
        {
          result = (FT_Pointer)desc->serv_data;
          break;
        }
      }
    }

    return result;
  }